

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_pedersen_commitment_serialize
              (secp256k1_context *ctx,uchar *output,secp256k1_pedersen_commitment *commit)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  secp256k1_ge ge;
  
  if (output == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "output != NULL";
  }
  else {
    if (commit != (secp256k1_pedersen_commitment *)0x0) {
      secp256k1_pedersen_commitment_load(&ge,commit);
      iVar1 = secp256k1_fe_is_quad_var(&ge.y);
      *output = (byte)iVar1 ^ 9;
      secp256k1_fe_normalize_var(&ge.x);
      secp256k1_fe_get_b32(output + 1,&ge.x);
      return 1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "commit != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_pedersen_commitment_serialize(const secp256k1_context* ctx, unsigned char *output, const secp256k1_pedersen_commitment* commit) {
    secp256k1_ge ge;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(commit != NULL);

    secp256k1_pedersen_commitment_load(&ge, commit);

    output[0] = 9 ^ secp256k1_fe_is_quad_var(&ge.y);
    secp256k1_fe_normalize_var(&ge.x);
    secp256k1_fe_get_b32(&output[1], &ge.x);
    return 1;
}